

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login1-server.c
# Opt level: O0

PacketProtocolLayer *
ssh1_login_server_new
          (PacketProtocolLayer *successor_layer,RSAKey *hostkey,AuthPolicy *authpolicy,
          SshServerConfig *ssc)

{
  void *__s;
  ssh1_login_server_state *s;
  SshServerConfig *ssc_local;
  AuthPolicy *authpolicy_local;
  RSAKey *hostkey_local;
  PacketProtocolLayer *successor_layer_local;
  
  __s = safemalloc(1,0x138,0);
  memset(__s,0,0x138);
  *(PacketProtocolLayerVtable **)((long)__s + 0xd0) = &ssh1_login_server_vtable;
  *(SshServerConfig **)((long)__s + 0x10) = ssc;
  *(RSAKey **)((long)__s + 0x90) = hostkey;
  *(AuthPolicy **)((long)__s + 0xa8) = authpolicy;
  *(PacketProtocolLayer **)((long)__s + 8) = successor_layer;
  return (PacketProtocolLayer *)((long)__s + 0xd0);
}

Assistant:

PacketProtocolLayer *ssh1_login_server_new(
    PacketProtocolLayer *successor_layer, RSAKey *hostkey,
    AuthPolicy *authpolicy, const SshServerConfig *ssc)
{
    struct ssh1_login_server_state *s = snew(struct ssh1_login_server_state);
    memset(s, 0, sizeof(*s));
    s->ppl.vt = &ssh1_login_server_vtable;

    s->ssc = ssc;
    s->hostkey = hostkey;
    s->authpolicy = authpolicy;

    s->successor_layer = successor_layer;
    return &s->ppl;
}